

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_vobj.c
# Opt level: O0

void read_section(GlobalVars *gv,ObjectUnit *u,uint32_t index,vobj_symbol *vsyms,int nsyms)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  taddr tVar4;
  taddr tVar5;
  size_t __n;
  void *__dest;
  Section *pSVar6;
  ulong uVar7;
  GlobalVars *pGVar8;
  ulong uVar9;
  char *pcVar10;
  long in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  int in_R8D;
  int sym_idx;
  uint8_t flags_1;
  uint16_t bsiz;
  uint16_t bpos;
  lword addend;
  lword mask;
  lword offs;
  char *xrefname;
  Reloc *r;
  lword last_offs;
  int last_sym;
  Reloc *last_reloc;
  char *name;
  char *attr;
  uint8_t *data;
  uint8_t align;
  uint8_t flags;
  uint8_t prot;
  uint8_t type;
  int nrelocs;
  lword fsize;
  lword dsize;
  Section *s;
  size_t in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  uint is_signed;
  uint32_t in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Section *in_stack_ffffffffffffff00;
  Section *in_stack_ffffffffffffff08;
  Section *obj;
  GlobalVars *in_stack_ffffffffffffff10;
  Reloc *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  GlobalVars *in_stack_ffffffffffffff28;
  uint8_t protection;
  undefined4 in_stack_ffffffffffffff30;
  uint8_t align_00;
  undefined8 in_stack_ffffffffffffff38;
  bool inv;
  ulong in_stack_ffffffffffffff40;
  bool local_ad;
  GlobalVars *local_80;
  int local_74;
  Reloc *local_70;
  byte *local_60;
  char local_4d;
  int local_4c;
  
  local_4d = '\x02';
  local_74 = -1;
  skip_string();
  local_60 = p;
  while( true ) {
    inv = (bool)in_stack_ffffffffffffff40;
    align_00 = (uint8_t)in_stack_ffffffffffffff38;
    protection = (uint8_t)in_stack_ffffffffffffff30;
    is_signed = (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (*local_60 == 0) break;
    iVar3 = tolower((uint)*local_60);
    in_stack_ffffffffffffff40 = (ulong)(iVar3 - 0x61);
    switch(in_stack_ffffffffffffff40) {
    case 0:
      break;
    case 2:
      local_4d = '\x01';
      break;
    case 3:
      local_4d = '\x02';
      break;
    case 0x14:
      local_4d = '\x03';
      break;
    case 0x16:
      break;
    case 0x17:
    }
    local_60 = local_60 + 1;
  }
  skip_string();
  read_number(is_signed);
  tVar4 = read_number(is_signed);
  lshiftcnt(tVar4);
  tVar4 = read_number(is_signed);
  tVar5 = read_number(is_signed);
  local_4c = (int)tVar5;
  __n = read_number(is_signed);
  if ((local_4d != '\x03') && ((long)__n < tVar4)) {
    __dest = alloczero(in_stack_fffffffffffffee0);
    memcpy(__dest,p,__n);
  }
  p = p + __n;
  obj = (Section *)((ulong)is_signed << 0x20);
  pSVar6 = add_section((ObjectUnit *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (char *)in_stack_ffffffffffffff18,(uint8_t *)in_stack_ffffffffffffff10,
                       (unsigned_long)in_stack_ffffffffffffff08,
                       (uint8_t)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                       (uint8_t)((ulong)in_stack_ffffffffffffff00 >> 0x30),protection,align_00,inv);
  pSVar6->id = in_EDX;
  local_70 = (Reloc *)0x0;
  local_80 = (GlobalVars *)0xffffffffffffffff;
  for (; 0 < local_4c; local_4c = local_4c + -1) {
    uVar7 = read_number((int)((ulong)obj >> 0x20));
    bVar1 = (byte)uVar7;
    pGVar8 = (GlobalVars *)read_number((int)((ulong)obj >> 0x20));
    uVar9 = read_number((int)((ulong)obj >> 0x20));
    tVar4 = read_number((int)((ulong)obj >> 0x20));
    uVar2 = (ushort)tVar4;
    tVar4 = read_number((int)((ulong)obj >> 0x20));
    read_number((int)((ulong)obj >> 0x20));
    tVar5 = read_number((int)((ulong)obj >> 0x20));
    iVar3 = (int)tVar5 + -1;
    local_ad = false;
    if ((((bVar1 == 0) || (0x10 < bVar1)) || ((long)pGVar8 < 0)) ||
       (((0x40 < uVar2 || (iVar3 < 0)) || (in_R8D <= iVar3)))) {
      if (bVar1 != 0) {
        in_stack_ffffffffffffff10 = (GlobalVars *)getobjname((ObjectUnit *)obj);
        in_stack_ffffffffffffff18 = (Reloc *)fff[*(byte *)(*(long *)(in_RSI + 0x10) + 0x38)]->tname;
        in_stack_ffffffffffffff24 = (uint)bVar1;
        if ((iVar3 < 0) || (in_R8D <= iVar3)) {
          obj = (Section *)0x141d15;
        }
        else {
          obj = *(Section **)(in_RCX + (long)iVar3 * 0x20);
        }
        if ((iVar3 < 0) || (in_R8D <= iVar3)) {
          in_stack_fffffffffffffefc = 0;
        }
        else {
          in_stack_fffffffffffffefc = *(undefined4 *)(in_RCX + (long)iVar3 * 0x20 + 8);
        }
        in_stack_ffffffffffffff00 = obj;
        in_stack_ffffffffffffff08 = obj;
        error(0x73,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
              (ulong)in_stack_ffffffffffffff24,pGVar8,uVar9 & 0xffff,(uint)uVar2,tVar4,obj,
              in_stack_fffffffffffffefc);
        in_stack_ffffffffffffff28 = pGVar8;
      }
    }
    else {
      if (*(int *)(in_RCX + (long)iVar3 * 0x20 + 8) != 1) {
        if (*(int *)(in_RCX + (long)iVar3 * 0x20 + 8) == 2) {
          local_ad = (*(uint *)(in_RCX + (long)iVar3 * 0x20 + 0xc) & 0x40) != 0;
        }
        else {
          pcVar10 = getobjname((ObjectUnit *)obj);
          obj = *(Section **)(in_RCX + (long)iVar3 * 0x20);
          error(0x73,pcVar10,fff[*(byte *)(*(long *)(in_RSI + 0x10) + 0x38)]->tname,uVar7 & 0xff,
                pGVar8,uVar9 & 0xffff,(uint)uVar2,tVar4,obj,
                *(undefined4 *)(in_RCX + (long)iVar3 * 0x20 + 8));
        }
      }
      if (((iVar3 != local_74) || (pGVar8 != local_80)) || (local_70 == (Reloc *)0x0)) {
        local_70 = newreloc(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                            (char *)in_stack_ffffffffffffff00,
                            (Section *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                            ,in_stack_fffffffffffffef4,(unsigned_long)obj,
                            (uint8_t)in_stack_ffffffffffffff20,(lword)in_stack_ffffffffffffff28);
        local_70->flags = local_70->flags | local_ad;
        local_80 = pGVar8;
        local_74 = iVar3;
      }
      addreloc(in_stack_ffffffffffffff00,
               (Reloc *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (uint16_t)(in_stack_fffffffffffffef4 >> 0x10),(uint16_t)in_stack_fffffffffffffef4,
               (lword)obj);
      writesection(in_stack_ffffffffffffff28,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18,(lword)in_stack_ffffffffffffff10);
    }
  }
  return;
}

Assistant:

static void read_section(struct GlobalVars *gv,struct ObjectUnit *u,
                         uint32_t index,struct vobj_symbol *vsyms,int nsyms)
{
  struct Section *s;
  lword dsize,fsize;
  int nrelocs;
  uint8_t type = ST_DATA;
  uint8_t prot = SP_READ;
  uint8_t flags = 0;
  uint8_t align,*data;
  char *attr;
  char *name = (char *)p;
  struct Reloc *last_reloc;
  int last_sym = -1;
  lword last_offs;

  skip_string();  /* section name */
  for (attr=(char *)p; *attr; attr++) {
    switch (tolower((unsigned char)*attr)) {
      case 'w': prot |= SP_WRITE; break;
      case 'x': prot |= SP_EXEC; break;
      case 'c': type = ST_CODE; break;
      case 'd': type = ST_DATA; break;
      case 'u': type = ST_UDATA; flags |= SF_UNINITIALIZED; break;
      case 'a': flags |= SF_ALLOC;
    }
  }
  skip_string();
  read_number(0);                 /* ignore flags */
  align = (uint8_t)lshiftcnt(read_number(0));
  dsize = read_number(0);         /* total size of section */
  nrelocs = (int)read_number(0);  /* number of relocation entries */
  fsize = read_number(0);         /* size in file, without 0-bytes */

  if (type == ST_UDATA) {
    data = NULL;
  }
  else if (dsize > fsize) {       /* recreate 0-bytes at end of section */
    data = alloczero((size_t)dsize);
    memcpy(data,p,(size_t)fsize);
  }
  else
    data = p;

  /* create and add section */
  p += fsize;
  s = add_section(u,name,data,(unsigned long)dsize,type,flags,prot,align,0);
  s->id = index;

  /* create relocations and unkown symbol references for this section */
  for (last_reloc=NULL,last_offs=-1; nrelocs>0; nrelocs--) {
    struct Reloc *r;
    char *xrefname = NULL;
    lword offs,mask,addend;
    uint16_t bpos,bsiz;
    uint8_t flags;
    int sym_idx;

    /* read one relocation entry */
    type = (uint8_t)read_number(0);
    offs = read_number(0);
    bpos = (uint16_t)read_number(0);
    bsiz = (uint16_t)read_number(0);
    mask = read_number(1);
    addend = read_number(1);
    sym_idx = (int)read_number(0) - 1;  /* symbol index */
    flags = 0;

    if (type>R_NONE && type<=LAST_STANDARD_RELOC &&
        offs>=0 && bsiz<=(sizeof(lword)<<3) &&
        sym_idx>=0 && sym_idx<nsyms) {
      if (vsyms[sym_idx].type == LABSYM) {
        xrefname = NULL;
        index = vsyms[sym_idx].sec;
      }
      else if (vsyms[sym_idx].type == IMPORT) {
        xrefname = vsyms[sym_idx].name;
        if (vsyms[sym_idx].flags & WEAK)
          flags |= RELF_WEAK;  /* undefined weak symbol */
        index = 0;
      }
      else {
        /* VOBJ relocation not supported */
        error(115,getobjname(u),fff[u->lnkfile->format]->tname,
              (int)type,(lword)offs,(int)bpos,(int)bsiz,(lword)mask,
              vsyms[sym_idx].name,(int)vsyms[sym_idx].type);
      }

      if (sym_idx==last_sym && offs==last_offs && last_reloc!=NULL) {
        r = last_reloc;
      }
      else {
        r = newreloc(gv,s,xrefname,NULL,index,(unsigned long)offs,type,addend);
        r->flags |= flags;
        last_reloc = r;
        last_offs = offs;
        last_sym = sym_idx;
      }

      addreloc(s,r,bpos,bsiz,mask);

      /* make sure that section reflects the addend for other formats */
      writesection(gv,data+(uint32_t)offs,r,addend);
    }

    else if (type != R_NONE) {
      /* VOBJ relocation not supported */
      error(115,getobjname(u),fff[u->lnkfile->format]->tname,
            (int)type,(lword)offs,(int)bpos,(int)bsiz,(lword)mask,
            (sym_idx>=0&&sym_idx<nsyms) ? vsyms[sym_idx].name : "?",
            (sym_idx>=0&&sym_idx<nsyms) ? (int)vsyms[sym_idx].type : 0);
    }
  }
}